

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UIDisplayer.cpp
# Opt level: O3

UIDisplayer * UIDisplayer::getInstance(GLfloat width,GLfloat height)

{
  UIDisplayer *pUVar1;
  Palette *pPVar2;
  PrimitiveDisplayer *pPVar3;
  TextDisplayer *pTVar4;
  
  if (uiDisplayer == (UIDisplayer *)0x0) {
    pUVar1 = (UIDisplayer *)operator_new(0x20);
    pUVar1->width = width;
    pUVar1->height = height;
    pPVar2 = Palette::getInstance();
    pUVar1->palette = pPVar2;
    pPVar3 = PrimitiveDisplayer::getInstance();
    pUVar1->primitiveDisplayer = pPVar3;
    pTVar4 = TextDisplayer::getInstance();
    pUVar1->textDisplayer = pTVar4;
    uiDisplayer = pUVar1;
  }
  return uiDisplayer;
}

Assistant:

UIDisplayer* UIDisplayer::getInstance(GLfloat width, GLfloat height) {
    if (uiDisplayer == nullptr) {
        uiDisplayer = new UIDisplayer(width, height);
    }
    return uiDisplayer;
}